

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

size_t __thiscall Centaurus::CharClass<wchar_t>::hash(CharClass<wchar_t> *this)

{
  bool bVar1;
  wchar_t wVar2;
  reference this_00;
  size_t sVar3;
  size_t sVar4;
  Range<wchar_t> *range;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_> *__range2;
  size_t value;
  CharClass<wchar_t> *pCStack_10;
  hash<wchar_t> hasher;
  CharClass<wchar_t> *this_local;
  
  __range2 = (vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_> *)0x0;
  pCStack_10 = this;
  __end0 = std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::
           begin(&this->m_ranges);
  range = (Range<wchar_t> *)
          std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::end
                    (&this->m_ranges);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                                *)&range);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
              ::operator*(&__end0);
    wVar2 = Range<wchar_t>::start(this_00);
    sVar3 = std::hash<wchar_t>::operator()((hash<wchar_t> *)((long)&value + 7),wVar2);
    wVar2 = Range<wchar_t>::end(this_00);
    sVar4 = std::hash<wchar_t>::operator()((hash<wchar_t> *)((long)&value + 7),wVar2);
    __range2 = (vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_> *)
               (sVar4 ^ sVar3 ^ (ulong)__range2);
    __gnu_cxx::
    __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
    ::operator++(&__end0);
  }
  return (size_t)__range2;
}

Assistant:

size_t hash() const
    {
        std::hash<TCHAR> hasher;
        size_t value = 0;
        for (const auto& range : m_ranges)
        {
            value ^= hasher(range.start());
            value ^= hasher(range.end());
        }
        return value;
    }